

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall dynet::Model::project_weights(Model *this,float radius)

{
  bool bVar1;
  size_type sVar2;
  reference ppPVar3;
  ostream *this_00;
  void *this_01;
  long in_RDI;
  undefined1 auVar4 [16];
  undefined1 auVar5 [64];
  undefined1 auVar6 [16];
  int i;
  double gg;
  ParameterStorageBase *p;
  iterator __end1;
  iterator __begin1;
  vector<dynet::ParameterStorageBase_*,_std::allocator<dynet::ParameterStorageBase_*>_> *__range1;
  int pi;
  vector<dynet::ParameterStorageBase_*,_std::allocator<dynet::ParameterStorageBase_*>_>
  *in_stack_ffffffffffffffa8;
  __normal_iterator<dynet::ParameterStorageBase_**,_std::vector<dynet::ParameterStorageBase_*,_std::allocator<dynet::ParameterStorageBase_*>_>_>
  *in_stack_ffffffffffffffb0;
  int local_3c;
  double local_38;
  __normal_iterator<dynet::ParameterStorageBase_**,_std::vector<dynet::ParameterStorageBase_*,_std::allocator<dynet::ParameterStorageBase_*>_>_>
  local_20;
  long local_18;
  int local_10;
  
  if (project_weights::project_scratch == (float *)0x0) {
    in_stack_ffffffffffffffb0 =
         *(__normal_iterator<dynet::ParameterStorageBase_**,_std::vector<dynet::ParameterStorageBase_*,_std::allocator<dynet::ParameterStorageBase_*>_>_>
           **)(dynet::default_device + 0x10);
    sVar2 = std::
            vector<dynet::ParameterStorageBase_*,_std::allocator<dynet::ParameterStorageBase_*>_>::
            size((vector<dynet::ParameterStorageBase_*,_std::allocator<dynet::ParameterStorageBase_*>_>
                  *)(in_RDI + 8));
    project_weights::project_scratch =
         (float *)(*(code *)in_stack_ffffffffffffffb0->_M_current[2])
                            (in_stack_ffffffffffffffb0,sVar2 << 2);
  }
  local_10 = 0;
  local_18 = in_RDI + 8;
  local_20._M_current =
       (ParameterStorageBase **)
       std::vector<dynet::ParameterStorageBase_*,_std::allocator<dynet::ParameterStorageBase_*>_>::
       begin(in_stack_ffffffffffffffa8);
  std::vector<dynet::ParameterStorageBase_*,_std::allocator<dynet::ParameterStorageBase_*>_>::end
            (in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffb0,
                       (__normal_iterator<dynet::ParameterStorageBase_**,_std::vector<dynet::ParameterStorageBase_*,_std::allocator<dynet::ParameterStorageBase_*>_>_>
                        *)in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    ppPVar3 = __gnu_cxx::
              __normal_iterator<dynet::ParameterStorageBase_**,_std::vector<dynet::ParameterStorageBase_*,_std::allocator<dynet::ParameterStorageBase_*>_>_>
              ::operator*(&local_20);
    (*(*ppPVar3)->_vptr_ParameterStorageBase[2])
              (*ppPVar3,project_weights::project_scratch + local_10);
    local_10 = local_10 + 1;
    __gnu_cxx::
    __normal_iterator<dynet::ParameterStorageBase_**,_std::vector<dynet::ParameterStorageBase_*,_std::allocator<dynet::ParameterStorageBase_*>_>_>
    ::operator++(&local_20);
  }
  auVar5 = ZEXT1664((undefined1  [16])0x0);
  local_38 = 0.0;
  for (local_3c = 0; auVar4 = auVar5._0_16_, local_3c < local_10; local_3c = local_3c + 1) {
    local_38 = (double)project_weights::project_scratch[local_3c] + local_38;
    auVar5 = ZEXT864((ulong)local_38);
  }
  this_00 = std::operator<<((ostream *)&std::cerr,"NORM: ");
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_38;
  auVar4 = vsqrtsd_avx(auVar4,auVar6);
  this_01 = (void *)std::ostream::operator<<(this_00,auVar4._0_8_);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Model::project_weights(float radius) {
  static float* project_scratch = 0;
  if (!project_scratch)
    project_scratch = (float*)default_device->mem->malloc(all_params.size() * sizeof(float));
  int pi = 0;
  for (auto p : all_params) {
    p->squared_l2norm(&project_scratch[pi]);
    ++pi;
  }
  double gg = 0;
  for (int i = 0; i < pi; ++i)
    gg += project_scratch[i];
  cerr << "NORM: " << sqrt(gg) << endl;
}